

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::WriteDebugInfo(Parser *this)

{
  size_t *pos;
  pointer pDVar1;
  DebugLineEntry *lineEntry;
  pointer data;
  undefined4 local_2c;
  int local_28;
  int local_24;
  
  local_2c = 0x4742444a;
  local_28 = (int)((ulong)((long)(this->m_debugLines).
                                 super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_debugLines).
                                super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_24 = local_28 + 8;
  pos = &(this->m_writer).m_pos;
  Buffer::Write((this->m_writer).m_buffer.
                super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pos,&local_2c,
                0xc);
  pDVar1 = (this->m_debugLines).
           super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (data = (this->m_debugLines).
              super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_start; data != pDVar1; data = data + 1) {
    Buffer::Write((this->m_writer).m_buffer.
                  super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pos,data,8);
  }
  return;
}

Assistant:

inline_t void Parser::WriteDebugInfo()
	{
		DebugHeader opcodeHeader;
		opcodeHeader.lineEntryCount = static_cast<uint32_t>(m_debugLines.size());
		opcodeHeader.dataSize = static_cast<uint32_t>(m_debugLines.size() + sizeof(DebugLineEntry));
		m_writer.Write(&opcodeHeader, sizeof(opcodeHeader));
		for (const auto & lineEntry : m_debugLines)
			m_writer.Write(&lineEntry, sizeof(lineEntry));
	}